

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void dc_store_64xh(__m128i *row,int height,uint8_t *dst,ptrdiff_t stride)

{
  longlong lVar1;
  int local_9c;
  longlong *local_90;
  int i;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  int height_local;
  __m128i *row_local;
  
  local_90 = (longlong *)dst;
  for (local_9c = 0; local_9c < height; local_9c = local_9c + 1) {
    lVar1 = (*row)[1];
    *local_90 = (*row)[0];
    local_90[1] = lVar1;
    lVar1 = (*row)[1];
    local_90[2] = (*row)[0];
    local_90[3] = lVar1;
    lVar1 = (*row)[1];
    local_90[4] = (*row)[0];
    local_90[5] = lVar1;
    lVar1 = (*row)[1];
    local_90[6] = (*row)[0];
    local_90[7] = lVar1;
    local_90 = (longlong *)((long)local_90 + stride);
  }
  return;
}

Assistant:

static inline void dc_store_64xh(const __m128i *row, int height, uint8_t *dst,
                                 ptrdiff_t stride) {
  for (int i = 0; i < height; ++i) {
    _mm_store_si128((__m128i *)dst, *row);
    _mm_store_si128((__m128i *)(dst + 16), *row);
    _mm_store_si128((__m128i *)(dst + 32), *row);
    _mm_store_si128((__m128i *)(dst + 48), *row);
    dst += stride;
  }
}